

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  STACK *pSVar5;
  ostream *poVar6;
  size_type sVar7;
  STACK *new_stack_1;
  STACK *new_stack;
  int i_1;
  int e;
  int i;
  int size;
  queue<int,_std::deque<int,_std::allocator<int>_>_> arg_list;
  undefined1 local_d0 [8];
  cmd_paresr lab01_parser;
  STACK *mystack;
  int arg;
  char op;
  char **argv_local;
  int argc_local;
  
  lab01_parser.args.c.
  super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  cmd_paresr::cmd_paresr((cmd_paresr *)local_d0,argc,argv);
  do {
    iVar2 = cmd_paresr::now_pos((cmd_paresr *)local_d0);
    iVar3 = cmd_paresr::ops_num((cmd_paresr *)local_d0);
    if (iVar3 <= iVar2) {
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      cmd_paresr::~cmd_paresr((cmd_paresr *)local_d0);
      return 0;
    }
    std::queue<int,std::deque<int,std::allocator<int>>>::
    queue<std::deque<int,std::allocator<int>>,void>
              ((queue<int,std::deque<int,std::allocator<int>>> *)&i);
    cVar1 = cmd_paresr::next_step
                      ((cmd_paresr *)local_d0,
                       (queue<int,_std::deque<int,_std::allocator<int>_>_> *)&i);
    switch(cVar1) {
    case 'A':
      std::operator<<((ostream *)&std::cout," A");
      pvVar4 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                         ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&i);
      iVar2 = *pvVar4;
      pSVar5 = (STACK *)operator_new(0x18);
      STACK::STACK(pSVar5,iVar2);
      (*pSVar5->_vptr_STACK[5])
                (pSVar5,lab01_parser.args.c.
                        super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node);
      lab01_parser.args.c.
      super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)pSVar5;
      std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
                ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&i);
      std::operator<<((ostream *)&std::cout," ");
      (*(code *)((*lab01_parser.args.c.
                   super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node)->c).
                super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_cur)();
      break;
    case 'C':
      std::operator<<((ostream *)&std::cout," C");
      pSVar5 = (STACK *)operator_new(0x18);
      STACK::STACK(pSVar5,(STACK *)lab01_parser.args.c.
                                   super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
                                   ._M_impl.super__Deque_impl_data._M_finish._M_node);
      lab01_parser.args.c.
      super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)pSVar5;
      std::operator<<((ostream *)&std::cout," ");
      (*(code *)((*lab01_parser.args.c.
                   super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node)->c).
                super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_cur)();
      break;
    case 'G':
      std::operator<<((ostream *)&std::cout," G");
      pvVar4 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                         ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&i);
      iVar2 = *pvVar4;
      iVar3 = (*(code *)((*lab01_parser.args.c.
                           super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node)->c).
                        super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                        _M_map_size)();
      if (iVar3 <= iVar2) {
        poVar6 = std::operator<<((ostream *)&std::cout," E");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        exit(0);
      }
      poVar6 = std::operator<<((ostream *)&std::cout," ");
      iVar2 = (*(code *)((*lab01_parser.args.c.
                           super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node)->c).
                        super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                        _M_start._M_cur)
                        (lab01_parser.args.c.
                         super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node,iVar2);
      std::ostream::operator<<(poVar6,iVar2);
      std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
                ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&i);
      break;
    case 'I':
      std::operator<<((ostream *)&std::cout," I");
      sVar7 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::size
                        ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&i);
      e = (int)sVar7;
      iVar2 = (*(code *)((*lab01_parser.args.c.
                           super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node)->c).
                        super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                        _M_map)();
      iVar3 = (*(code *)((*lab01_parser.args.c.
                           super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node)->c).
                        super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                        _M_map_size)();
      if (iVar2 - iVar3 < e) {
        poVar6 = std::operator<<((ostream *)&std::cout," E");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        exit(0);
      }
      for (i_1 = 0; i_1 < e; i_1 = i_1 + 1) {
        pvVar4 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                           ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&i);
        (*(code *)((*lab01_parser.args.c.
                     super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node)->c).
                  super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                  _M_start._M_first)
                  (lab01_parser.args.c.
                   super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node,*pvVar4);
        std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
                  ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&i);
      }
      std::operator<<((ostream *)&std::cout," ");
      (*(code *)((*lab01_parser.args.c.
                   super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node)->c).
                super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_cur)();
      break;
    case 'N':
      std::operator<<((ostream *)&std::cout," N");
      poVar6 = std::operator<<((ostream *)&std::cout," ");
      iVar2 = (*(code *)((*lab01_parser.args.c.
                           super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node)->c).
                        super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                        _M_map_size)();
      std::ostream::operator<<(poVar6,iVar2);
      break;
    case 'O':
      std::operator<<((ostream *)&std::cout," O");
      pvVar4 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                         ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&i);
      iVar2 = *pvVar4;
      iVar3 = (*(code *)((*lab01_parser.args.c.
                           super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node)->c).
                        super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                        _M_map_size)();
      if (iVar3 < iVar2) {
        poVar6 = std::operator<<((ostream *)&std::cout," E");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        exit(0);
      }
      for (new_stack._0_4_ = 0; (int)new_stack < iVar2; new_stack._0_4_ = (int)new_stack + 1) {
        (*(code *)((*lab01_parser.args.c.
                     super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node)->c).
                  super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                  _M_start._M_last)
                  (lab01_parser.args.c.
                   super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node,(long)&new_stack + 4);
      }
      std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
                ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&i);
      iVar2 = (*(code *)((*lab01_parser.args.c.
                           super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node)->c).
                        super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                        _M_map_size)();
      if (iVar2 != 0) {
        std::operator<<((ostream *)&std::cout," ");
        (*(code *)((*lab01_parser.args.c.
                     super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node)->c).
                  super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
                  _M_finish._M_cur)();
      }
      break;
    case 'S':
      std::operator<<((ostream *)&std::cout,"S");
      pvVar4 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                         ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&i);
      iVar2 = *pvVar4;
      pSVar5 = (STACK *)operator_new(0x18);
      STACK::STACK(pSVar5,iVar2);
      lab01_parser.args.c.
      super__Deque_base<std::queue<int,_std::deque<int,_std::allocator<int>_>_>,_std::allocator<std::queue<int,_std::deque<int,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)pSVar5;
      poVar6 = std::operator<<((ostream *)&std::cout," ");
      std::ostream::operator<<(poVar6,iVar2);
      std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
                ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&i);
    }
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&i);
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
  char op;
  int arg;
  STACK *mystack = nullptr;
  // Set output file
  cmd_paresr lab01_parser = cmd_paresr(argc, argv);
  while (lab01_parser.now_pos() < lab01_parser.ops_num()) {
    queue<int> arg_list;
    op = lab01_parser.next_step(arg_list);
    switch (op) {
      case 'S': {
        cout << "S";
        arg = arg_list.front();
        mystack = new STACK(arg);
        cout << " " << arg;
        arg_list.pop();
        break;
      }
      case 'I': {
        cout << " I";
        int size = arg_list.size();
        // Test if the stack can overflow
        if (mystack->size() - int(*mystack) < size) {
          cout << " E" << endl;
          exit(0);
        }
        for (int i = 0; i < size; i++) {
          arg = arg_list.front();
          *mystack << arg;
          arg_list.pop();
        }
        cout << " ";
        mystack->print();
        break;
      }
      case 'O': {
        cout << " O";
        int e;
        arg = arg_list.front();
        // Test if the stack can be empty
        if (int(*mystack) < arg) {
          cout << " E" << endl;
          exit(0);
        }
        for (int i = 0; i < arg; i++)
          *mystack >> e;
        arg_list.pop();
        if (int(*mystack) != 0) {
          cout << " ";
          mystack->print();
        }
        break;
      }
      case 'A': {
        cout << " A";
        arg = arg_list.front();
        STACK *new_stack = new STACK(arg);
        *new_stack = *mystack;
        mystack = new_stack;
        arg_list.pop();
        cout << " ";
        mystack->print();
        break;
      }
      case 'C': {
        cout << " C";
        STACK *new_stack = new STACK(*mystack);
        mystack = new_stack;
        cout << " ";
        mystack->print();  
        break;
      }
      case 'N': {
        cout << " N";
        cout << " " << int(*mystack);
        break;
      }
      case 'G': {
        cout << " G";
        arg = arg_list.front();
        if (arg >= int(*mystack)) {
          cout << " E" << endl;
          exit(0);
        }
        cout << " " << (*mystack)[arg];
        arg_list.pop();
        break;
      }
    }
  }
  cout << endl;
  return 0;
}